

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O1

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::InitOwnOptions(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *this)

{
  Env *pEVar1;
  ValueArrayRef values;
  string local_40;
  
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_BasicConverter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
               super_EnvKeeper.env_)->super_SolverOptionManager,"cvt:sos sos",
             "0/1*: Whether to honor declared suffixes .sosno and .ref describing SOS sets. Each distinct nonzero .sosno value designates an SOS set, of type 1 for positive .sosno values and of type 2 for negative values.  The .ref suffix contains corresponding reference values used to order the variables."
             ,&(this->options_).sos_,0,1);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_BasicConverter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
               super_EnvKeeper.env_)->super_SolverOptionManager,"cvt:sos2 sos2",
             "0*/1: Whether to honor SOS2 constraints for nonconvex piecewise-linear terms, using suffixes .sos and .sosref provided by AMPL. Currently under rework."
             ,&(this->options_).sos2_,0,1);
  pEVar1 = (this->super_BasicConverter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
           super_EnvKeeper.env_;
  fmt::format<int>(&local_40,(CStringRef)0x49ee2f,&this->prepro_products_);
  SolverOptionManager::AddStoredOption<int>
            (&pEVar1->super_SolverOptionManager,"cvt:prod cvt:pre:prod",local_40._M_dataplus._M_p,
             &this->prepro_products_,0,0x3ff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  values._8_8_ = 3;
  values.values_ = values_dvelim;
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_BasicConverter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
               super_EnvKeeper.env_)->super_SolverOptionManager,"cvt:dvelim dvelim",
             "Eliminate AMPL defined variables by substitution into linear, quadratic, and polynomial expressions:\n\n.. value-table::\n\nSee also AMPL options linelim and substout."
             ,&this->dvelim_,values);
  return;
}

Assistant:

void InitOwnOptions() {
    GetEnv().AddOption("cvt:sos sos",
        "0/1*: Whether to honor declared suffixes .sosno and .ref describing "
        "SOS sets. Each distinct nonzero .sosno "
        "value designates an SOS set, of type 1 for "
        "positive .sosno values and of type 2 for "
        "negative values.  The .ref suffix contains "
        "corresponding reference values used to order the variables.",
        options_.sos_, 0, 1);
    GetEnv().AddOption("cvt:sos2 sos2",
        "0*/1: Whether to honor SOS2 constraints for nonconvex "
        "piecewise-linear terms, using suffixes .sos and .sosref "
        "provided by AMPL. Currently under rework.",
        options_.sos2_, 0, 1);
    GetEnv().AddOption("cvt:prod cvt:pre:prod",
                       fmt::format("Product preprocessing flags. "
                       "Sum of a subset of the following bits:\n"
                       "\n"
                       "| 1 - Quadratize higher-order products in the "
                       "      following order: integer terms first, "
                       "      then real-valued ones; in each group, "
                       "      smaller-range terms first.\n"
                       "| 2 - Logicalize products of 2 binary terms. Logicalizing "
                       "      means that the product is converted to a conjunction. "
                       "      If the solver does not support it natively (see acc:and), "
                       "      the conjunction is linearized.\n"
                       "| 4 - Logicalize products of >=3 binary terms.\n"
                       "\n"
                       "Default: {}.\n"
                       "\n"
                                   "Bits 2 or 4 imply bit 1.", prepro_products_).c_str(),
                       prepro_products_, 0, 1023);
    GetEnv().AddStoredOption("cvt:dvelim dvelim",
                       "Eliminate AMPL defined variables "
                       "by substitution into linear, quadratic, and polynomial "
                       "expressions:\n"
                       "\n.. value-table::\n"
                             "\nSee also AMPL options linelim and substout.",
                       dvelim_, values_dvelim);
  }